

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O0

int __thiscall
helics::CommsInterface::connect(CommsInterface *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  bool bVar1;
  ConnectionStatus CVar2;
  undefined7 extraout_var;
  ulong extraout_RAX;
  undefined7 extraout_var_00;
  ulong extraout_RAX_00;
  unique_lock<std::mutex> syncLock;
  size_type in_stack_00001318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  CommsInterface *in_stack_ffffffffffffff58;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff60;
  TriggerVariable *in_stack_ffffffffffffff70;
  type *in_stack_ffffffffffffff78;
  thread *in_stack_ffffffffffffff80;
  thread local_78;
  CommsInterface *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  CommsInterface *in_stack_ffffffffffffffc0;
  string_view in_stack_ffffffffffffffc8;
  bool local_1;
  ulong uVar3;
  
  bVar1 = isConnected(this);
  uVar3 = CONCAT71(extraout_var,bVar1);
  if (bVar1) {
    local_1 = true;
  }
  else {
    CVar2 = std::atomic::operator_cast_to_ConnectionStatus
                      ((atomic<helics::CommsInterface::ConnectionStatus> *)0x461a12);
    uVar3 = (ulong)(uint)CVar2;
    if (CVar2 == STARTUP) {
      CVar2 = std::atomic::operator_cast_to_ConnectionStatus
                        ((atomic<helics::CommsInterface::ConnectionStatus> *)0x461a35);
      uVar3 = (ulong)(uint)CVar2;
      if (CVar2 == STARTUP) {
        bVar1 = std::function::operator_cast_to_bool
                          ((function<void_(helics::ActionMessage_&&)> *)this);
        if (bVar1) {
          bVar1 = propertyLock(in_stack_ffffffffffffff58);
          if (bVar1) {
            std::unique_lock<std::mutex>::unique_lock
                      ((unique_lock<std::mutex> *)this,(mutex_type *)in_stack_ffffffffffffff48);
            bVar1 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x461ae7);
            if (bVar1) {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                        in_stack_ffffffffffffff48);
            }
            bVar1 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x461b40);
            if (bVar1) {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                        in_stack_ffffffffffffff48);
            }
            bVar1 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x461b76);
            if (bVar1) {
              gmlc::utilities::randomString_abi_cxx11_(in_stack_00001318);
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
            }
            if ((this->singleThread & 1U) == 0) {
              local_70 = this;
              std::thread::thread<helics::CommsInterface::connect()::__0,,void>
                        (in_stack_ffffffffffffff80,(type *)in_stack_ffffffffffffff78);
              CLI::std::thread::operator=((thread *)this,(thread *)in_stack_ffffffffffffff48);
              CLI::std::thread::~thread((thread *)0x461bf6);
            }
            std::thread::thread<helics::CommsInterface::connect()::__1,,void>
                      ((thread *)this,in_stack_ffffffffffffff78);
            CLI::std::thread::operator=((thread *)this,&local_78);
            CLI::std::thread::~thread((thread *)0x461c34);
            std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)this);
            gmlc::concurrency::TriggerVariable::waitActivation(in_stack_ffffffffffffff70);
            gmlc::concurrency::TriggerVariable::waitActivation(in_stack_ffffffffffffff70);
            CVar2 = std::atomic::operator_cast_to_ConnectionStatus
                              ((atomic<helics::CommsInterface::ConnectionStatus> *)0x461c74);
            if (CVar2 == CONNECTED) {
              CVar2 = std::atomic::operator_cast_to_ConnectionStatus
                                ((atomic<helics::CommsInterface::ConnectionStatus> *)0x461dde);
              if (CVar2 == CONNECTED) {
                local_1 = true;
              }
              else {
                bVar1 = CLI::std::atomic<bool>::load
                                  ((atomic<bool> *)in_stack_ffffffffffffff58,
                                   (memory_order)((ulong)this >> 0x20));
                if (!bVar1) {
                  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            (in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
                  logError(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8);
                }
                if (((this->singleThread & 1U) == 0) &&
                   (CVar2 = std::atomic::operator_cast_to_ConnectionStatus
                                      ((atomic<helics::CommsInterface::ConnectionStatus> *)0x461e4a)
                   , CVar2 == CONNECTED)) {
                  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)this);
                  bVar1 = CLI::std::thread::joinable((thread *)this);
                  if (bVar1) {
                    std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)this);
                    (*this->_vptr_CommsInterface[7])();
                    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)this);
                    bVar1 = CLI::std::thread::joinable((thread *)this);
                    if (bVar1) {
                      std::thread::join();
                    }
                  }
                  std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)this);
                }
                std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)this);
                bVar1 = CLI::std::thread::joinable((thread *)this);
                if (bVar1) {
                  std::thread::join();
                }
                local_1 = false;
              }
            }
            else {
              bVar1 = CLI::std::atomic<bool>::load
                                ((atomic<bool> *)in_stack_ffffffffffffff58,
                                 (memory_order)((ulong)this >> 0x20));
              if (!bVar1) {
                CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
                logError(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8);
              }
              CVar2 = std::atomic::operator_cast_to_ConnectionStatus
                                ((atomic<helics::CommsInterface::ConnectionStatus> *)0x461cd1);
              if (CVar2 == CONNECTED) {
                std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)this);
                bVar1 = CLI::std::thread::joinable((thread *)this);
                if (bVar1) {
                  std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)this);
                  (*this->_vptr_CommsInterface[6])();
                  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)this);
                  bVar1 = CLI::std::thread::joinable((thread *)this);
                  if (bVar1) {
                    std::thread::join();
                  }
                }
                std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)this);
              }
              if ((this->singleThread & 1U) == 0) {
                std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)this);
                bVar1 = CLI::std::thread::joinable((thread *)this);
                if (bVar1) {
                  std::thread::join();
                }
              }
              local_1 = false;
            }
            std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)this);
            uVar3 = extraout_RAX_00;
          }
          else {
            local_1 = isConnected(this);
            uVar3 = CONCAT71(extraout_var_00,local_1);
          }
        }
        else {
          CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
          logError(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8);
          local_1 = false;
          uVar3 = extraout_RAX;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  return (int)CONCAT71((int7)(uVar3 >> 8),local_1);
}

Assistant:

bool CommsInterface::connect()
{
    if (isConnected()) {
        return true;
    }
    if (rxStatus != ConnectionStatus::STARTUP) {
        return false;
    }
    if (txStatus != ConnectionStatus::STARTUP) {
        return false;
    }
    // bool exp = false;
    if (!ActionCallback) {
        logError("no callback specified, the receiver cannot start");
        return false;
    }
    if (!propertyLock()) {
        // this will lock all the properties and should not be unlocked;
        return isConnected();
    }
    std::unique_lock<std::mutex> syncLock(threadSyncLock);
    if (name.empty()) {
        name = localTargetAddress;
    }
    if (localTargetAddress.empty()) {
        localTargetAddress = name;
    }
    if (randomID.empty()) {
        randomID = gmlc::utilities::randomString(10);
    }
    if (!singleThread) {
        queue_watcher = std::thread([this] {
            try {
                queue_rx_function();
            }
            catch (const std::exception& e) {
                rxStatus = ConnectionStatus::ERRORED;
                logError(std::string("error in receiver >") + e.what());
            }
        });
    }

    queue_transmitter = std::thread([this] {
        try {
            queue_tx_function();
        }
        catch (const std::exception& e) {
            txStatus = ConnectionStatus::ERRORED;
            logError(std::string("error in transmitter >") + e.what());
        }
    });
    syncLock.unlock();
    txTrigger.waitActivation();
    rxTrigger.waitActivation();
    if (rxStatus != ConnectionStatus::CONNECTED) {
        if (!requestDisconnect.load()) {
            logError("receiver connection failure");
        }

        if (txStatus == ConnectionStatus::CONNECTED) {
            syncLock.lock();
            if (queue_transmitter.joinable()) {
                syncLock.unlock();
                closeTransmitter();
                syncLock.lock();
                if (queue_transmitter.joinable()) {
                    queue_transmitter.join();
                }
            }
            syncLock.unlock();
        }
        if (!singleThread) {
            syncLock.lock();
            if (queue_watcher.joinable()) {
                queue_watcher.join();
            }
        }
        return false;
    }

    if (txStatus != ConnectionStatus::CONNECTED) {
        if (!requestDisconnect.load()) {
            logError("transmitter connection failure");
        }
        if (!singleThread) {
            if (rxStatus == ConnectionStatus::CONNECTED) {
                syncLock.lock();
                if (queue_watcher.joinable()) {
                    syncLock.unlock();
                    closeReceiver();
                    syncLock.lock();
                    if (queue_watcher.joinable()) {
                        queue_watcher.join();
                    }
                }
                syncLock.unlock();
            }
        }
        syncLock.lock();
        if (queue_transmitter.joinable()) {
            queue_transmitter.join();
        }
        return false;
    }
    return true;
}